

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O2

uint32_t * pack27_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint32_t uVar1;
  uint uVar2;
  
  uVar1 = *in;
  *out = uVar1 - base;
  *out = (in[1] - base) * 0x8000000 | uVar1 - base;
  uVar2 = in[1] - base >> 5;
  out[1] = uVar2;
  out[1] = (in[2] - base) * 0x400000 | uVar2;
  uVar2 = in[2] - base >> 10;
  out[2] = uVar2;
  out[2] = (in[3] - base) * 0x20000 | uVar2;
  uVar2 = in[3] - base >> 0xf;
  out[3] = uVar2;
  out[3] = (in[4] - base) * 0x1000 | uVar2;
  uVar2 = in[4] - base >> 0x14;
  out[4] = uVar2;
  out[4] = (in[5] - base) * 0x80 | uVar2;
  uVar2 = in[5] - base >> 0x19;
  out[5] = uVar2;
  uVar2 = (in[6] - base) * 4 | uVar2;
  out[5] = uVar2;
  out[5] = (in[7] - base) * 0x20000000 | uVar2;
  out[6] = in[7] - base >> 3;
  return out + 7;
}

Assistant:

uint32_t * pack27_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  27 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  22 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  22 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  17 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  17 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  12 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  7 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  7 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  2 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  2 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  29 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 27  -  24 );
    ++in;

    return out + 1;
}